

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexManager.cpp
# Opt level: O2

void __thiscall IndexManager::CreateIndexFile(IndexManager *this,IndexInfo *I)

{
  int iVar1;
  ostream *poVar2;
  string filename;
  BpTree<int> Tree_I;
  string local_130;
  string local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>
  local_f0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  poVar2 = std::operator<<((ostream *)&std::cout,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator+(&local_60,&this->Direction,&I->tableName);
  std::operator+(&local_40,&local_60,"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Tree_I,
                 &local_40,&I->indexName);
  std::operator+(&local_f0.first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Tree_I,
                 "_idx.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&Tree_I);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::operator<<((ostream *)&std::cout,(string *)&filename);
  iVar1 = I->type;
  if (iVar1 == 90000) {
    std::__cxx11::string::string((string *)&local_110,(string *)&filename);
    BpTree<float>::BpTree((BpTree<float> *)&Tree_I,&local_110,'1');
    std::__cxx11::string::~string((string *)&local_110);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BpTree<float>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
                *)&local_f0,&filename,(BpTree<float> *)&Tree_I);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<float>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<float>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<float>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,BpTree<float>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<float>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<float>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<float>>>>
                *)&this->BpTrees_F,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
                *)&local_f0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<float>_>
             *)&local_f0);
    BpTree<float>::~BpTree((BpTree<float> *)&Tree_I);
  }
  else if (iVar1 == 50000) {
    std::__cxx11::string::string((string *)&local_80,(string *)&filename);
    BpTree<int>::BpTree(&Tree_I,&local_80,'0');
    std::__cxx11::string::~string((string *)&local_80);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BpTree<int>_&,_true>
              (&local_f0,&filename,&Tree_I);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<int>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<int>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,BpTree<int>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<int>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<int>>>>
                *)&this->BpTrees_I,&local_f0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<int>_>
    ::~pair(&local_f0);
    BpTree<int>::~BpTree(&Tree_I);
  }
  else if (120000 < iVar1) {
    std::__cxx11::string::string((string *)&local_130,(string *)&filename);
    BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BpTree
              ((BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&Tree_I,&local_130,'2');
    std::__cxx11::string::~string((string *)&local_130);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f0,&filename,
               (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&Tree_I);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,BpTree<std::__cxx11::string>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BpTree<std::__cxx11::string>>>>
                *)&this->BpTrees_S,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f0);
    BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~BpTree((BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&Tree_I);
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void IndexManager::CreateIndexFile(IndexInfo I) {
	string filename;
	cout<<"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx"<<endl;
	filename = Direction + I.tableName + "_" + I.indexName + "_idx.dat";
	cout<<filename;
	if (I.type == 50000) {
		BpTree<int> Tree_I = BpTree<int>(filename, INT);
		this->BpTrees_I.insert(pair<string, BpTree<int> > (filename, Tree_I));
	}
	else if (I.type == 90000) {
		BpTree<float> Tree_F = BpTree<float>(filename, FLOAT);
		this->BpTrees_F.insert(pair<string, BpTree<float> >(filename, Tree_F));
	}
	else if (I.type > 120000) {
		BpTree<string> Tree_S = BpTree<string>(filename, STRING);
		this->BpTrees_S.insert(pair<string, BpTree<string> >(filename, Tree_S));
	}
}